

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

int ikcp_send(ikcpcb *kcp,char *buffer,int len)

{
  IKCPSEG *pIVar1;
  IKCPSEG *pIVar2;
  IUINT32 local_58;
  IUINT32 local_54;
  int local_50;
  int size;
  int extend;
  int capacity;
  IKCPSEG *old;
  int i;
  int count;
  IKCPSEG *seg;
  char *pcStack_20;
  int len_local;
  char *buffer_local;
  ikcpcb *kcp_local;
  
  if (kcp->mss == 0) {
    __assert_fail("kcp->mss > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0x1da,"int ikcp_send(ikcpcb *, const char *, int)");
  }
  if (len < 0) {
    kcp_local._4_4_ = -1;
  }
  else {
    seg._4_4_ = len;
    pcStack_20 = buffer;
    if (kcp->stream != 0) {
      if ((&kcp->snd_queue != (kcp->snd_queue).next) &&
         (pIVar2 = (IKCPSEG *)(kcp->snd_queue).prev, pIVar2->len < kcp->mss)) {
        local_50 = kcp->mss - pIVar2->len;
        if (len < local_50) {
          local_50 = len;
        }
        pIVar1 = ikcp_segment_new(kcp,pIVar2->len + local_50);
        if (pIVar1 == (IKCPSEG *)0x0) {
          __assert_fail("seg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                        ,0x1e5,"int ikcp_send(ikcpcb *, const char *, int)");
        }
        if (pIVar1 == (IKCPSEG *)0x0) {
          return -2;
        }
        (pIVar1->node).prev = (kcp->snd_queue).prev;
        (pIVar1->node).next = &kcp->snd_queue;
        ((kcp->snd_queue).prev)->next = &pIVar1->node;
        (kcp->snd_queue).prev = &pIVar1->node;
        memcpy(pIVar1->data,pIVar2->data,(ulong)pIVar2->len);
        if (buffer != (char *)0x0) {
          memcpy(pIVar1->data + pIVar2->len,buffer,(long)local_50);
          pcStack_20 = buffer + local_50;
        }
        pIVar1->len = pIVar2->len + local_50;
        pIVar1->frg = 0;
        seg._4_4_ = len - local_50;
        ((pIVar2->node).next)->prev = (pIVar2->node).prev;
        ((pIVar2->node).prev)->next = (pIVar2->node).next;
        (pIVar2->node).next = (IQUEUEHEAD *)0x0;
        (pIVar2->node).prev = (IQUEUEHEAD *)0x0;
        (pIVar2->node).next = (IQUEUEHEAD *)pIVar2;
        (pIVar2->node).prev = (IQUEUEHEAD *)pIVar2;
        ikcp_segment_delete(kcp,pIVar2);
      }
      if ((int)seg._4_4_ < 1) {
        return 0;
      }
    }
    if ((int)kcp->mss < (int)seg._4_4_) {
      old._4_4_ = ((seg._4_4_ + kcp->mss) - 1) / kcp->mss;
    }
    else {
      old._4_4_ = 1;
    }
    if ((int)old._4_4_ < 0x80) {
      if (old._4_4_ == 0) {
        old._4_4_ = 1;
      }
      for (old._0_4_ = 0; (int)old < (int)old._4_4_; old._0_4_ = (int)old + 1) {
        if ((int)kcp->mss < (int)seg._4_4_) {
          local_54 = kcp->mss;
        }
        else {
          local_54 = seg._4_4_;
        }
        pIVar2 = ikcp_segment_new(kcp,local_54);
        if (pIVar2 == (IKCPSEG *)0x0) {
          __assert_fail("seg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                        ,0x206,"int ikcp_send(ikcpcb *, const char *, int)");
        }
        if (pIVar2 == (IKCPSEG *)0x0) {
          return -2;
        }
        if ((pcStack_20 != (char *)0x0) && (0 < (int)seg._4_4_)) {
          memcpy(pIVar2->data,pcStack_20,(long)(int)local_54);
        }
        pIVar2->len = local_54;
        if (kcp->stream == 0) {
          local_58 = (old._4_4_ - (int)old) - 1;
        }
        else {
          local_58 = 0;
        }
        pIVar2->frg = local_58;
        (pIVar2->node).next = &pIVar2->node;
        (pIVar2->node).prev = &pIVar2->node;
        (pIVar2->node).prev = (kcp->snd_queue).prev;
        (pIVar2->node).next = &kcp->snd_queue;
        ((kcp->snd_queue).prev)->next = &pIVar2->node;
        (kcp->snd_queue).prev = &pIVar2->node;
        kcp->nsnd_que = kcp->nsnd_que + 1;
        if (pcStack_20 != (char *)0x0) {
          pcStack_20 = pcStack_20 + (int)local_54;
        }
        seg._4_4_ = seg._4_4_ - local_54;
      }
      kcp_local._4_4_ = 0;
    }
    else {
      kcp_local._4_4_ = -2;
    }
  }
  return kcp_local._4_4_;
}

Assistant:

int ikcp_send(ikcpcb *kcp, const char *buffer, int len)
{
	IKCPSEG *seg;
	int count, i;

	assert(kcp->mss > 0);
	if (len < 0) return -1;

	// append to previous segment in streaming mode (if possible)
	if (kcp->stream != 0) {
		if (!iqueue_is_empty(&kcp->snd_queue)) {
			IKCPSEG *old = iqueue_entry(kcp->snd_queue.prev, IKCPSEG, node);
			if (old->len < kcp->mss) {
				int capacity = kcp->mss - old->len;
				int extend = (len < capacity)? len : capacity;
				seg = ikcp_segment_new(kcp, old->len + extend);
				assert(seg);
				if (seg == NULL) {
					return -2;
				}
				iqueue_add_tail(&seg->node, &kcp->snd_queue);
				memcpy(seg->data, old->data, old->len);
				if (buffer) {
					memcpy(seg->data + old->len, buffer, extend);
					buffer += extend;
				}
				seg->len = old->len + extend;
				seg->frg = 0;
				len -= extend;
				iqueue_del_init(&old->node);
				ikcp_segment_delete(kcp, old);
			}
		}
		if (len <= 0) {
			return 0;
		}
	}

	if (len <= (int)kcp->mss) count = 1;
	else count = (len + kcp->mss - 1) / kcp->mss;

	if (count >= (int)IKCP_WND_RCV) return -2;

	if (count == 0) count = 1;

	// fragment
	for (i = 0; i < count; i++) {
		int size = len > (int)kcp->mss ? (int)kcp->mss : len;
		seg = ikcp_segment_new(kcp, size);
		assert(seg);
		if (seg == NULL) {
			return -2;
		}
		if (buffer && len > 0) {
			memcpy(seg->data, buffer, size);
		}
		seg->len = size;
		seg->frg = (kcp->stream == 0)? (count - i - 1) : 0;
		iqueue_init(&seg->node);
		iqueue_add_tail(&seg->node, &kcp->snd_queue);
		kcp->nsnd_que++;
		if (buffer) {
			buffer += size;
		}
		len -= size;
	}

	return 0;
}